

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  LNode *ExampleLNode;
  
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  std::ios::tie((ostream *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  malloc(0x10);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(nullptr),cout.tie(nullptr);
    //用C语句来分配LNode型空间申请结点示例
    LNode *ExampleLNode = (LNode*)malloc(sizeof(LNode));
    //do something...
    return 0;
}